

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Quoted_String_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                 *this)

{
  Position *this_00;
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  eval_error *this_01;
  char *pcVar4;
  byte bVar5;
  int iVar6;
  char cVar7;
  string local_58;
  File_Position local_38;
  
  pcVar3 = (this->m_position).m_pos;
  if ((pcVar3 == (this->m_position).m_end) || (*pcVar3 != '\"')) {
    return false;
  }
  this_00 = &this->m_position;
  Position::operator++(this_00);
  pcVar3 = (this->m_position).m_pos;
  if (pcVar3 != (this->m_position).m_end) {
    cVar7 = '\"';
    bVar5 = 0;
    iVar6 = 0;
    do {
      if (((*pcVar3 == '\"') && (iVar6 < 1)) && (cVar7 != '\\')) {
        Position::operator++(this_00);
        return true;
      }
      bVar2 = Eol_(this,false);
      if (!bVar2) {
        pcVar3 = (this->m_position).m_pos;
        pcVar1 = (this->m_position).m_end;
        if (cVar7 == '\\') {
LAB_004a3533:
          if (pcVar3 == pcVar1) {
            pcVar3 = "";
          }
          iVar6 = iVar6 - (uint)(~bVar5 & *pcVar3 == '}');
          if (cVar7 != '\\') goto LAB_004a355a;
          cVar7 = '\0';
        }
        else {
          if (cVar7 == '$') {
            pcVar4 = pcVar3;
            if (pcVar3 == pcVar1) {
              pcVar4 = "";
            }
            if (*pcVar4 != '{') goto LAB_004a351e;
            iVar6 = iVar6 + 1;
            pcVar3 = pcVar4;
          }
          else {
LAB_004a351e:
            pcVar4 = pcVar3;
            if (pcVar3 == pcVar1) {
              pcVar4 = "";
            }
            if (*pcVar4 != '\"') goto LAB_004a3533;
            bVar5 = bVar5 ^ 1;
            pcVar3 = pcVar4;
          }
LAB_004a355a:
          cVar7 = *pcVar3;
        }
        Position::operator++(this_00);
      }
      pcVar3 = (this->m_position).m_pos;
    } while (pcVar3 != (this->m_position).m_end);
  }
  this_01 = (eval_error *)__cxa_allocate_exception(0x90);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unclosed quoted string","");
  local_38.line = (this->m_position).line;
  local_38.column = (this->m_position).col;
  exception::eval_error::eval_error
            (this_01,&local_58,&local_38,
             (this->m_filename).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  __cxa_throw(this_01,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }